

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void av1_twopass_postencode_update(AV1_COMP *cpi)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  long *in_RDI;
  int prob_1;
  int new_prob_3;
  int left_1;
  FRAME_UPDATE_TYPE update_type_4;
  int new_prob_2;
  FRAME_UPDATE_TYPE update_type_3;
  int new_prob_1;
  FRAME_UPDATE_TYPE update_type_2;
  int prob;
  int new_prob;
  int left;
  FRAME_UPDATE_TYPE update_type_1;
  int loop;
  int j;
  int i;
  FrameProbInfo *frame_probs;
  int fast_extra_thresh;
  int pct_error_1;
  int pct_error;
  int maxq_adj_limit;
  int minq_adj_limit;
  int i_1;
  int pyramid_level;
  FIRSTPASS_STATS this_frame;
  int update_type;
  RateControlCfg *rc_cfg;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  TWO_PASS *twopass;
  FIRSTPASS_STATS *in_stack_fffffffffffffe68;
  AV1_COMP *in_stack_fffffffffffffe70;
  AV1_COMP *cpi_00;
  TWO_PASS *in_stack_fffffffffffffe78;
  int local_17c;
  int local_174;
  int local_15c;
  int local_154;
  int local_14c;
  int local_148;
  int local_144;
  int local_120;
  
  lVar10 = *in_RDI;
  plVar8 = in_RDI + 0xc0ee;
  lVar4 = *in_RDI;
  iVar6 = is_stat_consumption_stage(in_stack_fffffffffffffe70);
  if (((iVar6 != 0) &&
      (((int)in_RDI[0x13acb] == 0 || (*(char *)((long)in_RDI + 0x9d661) != '\x01')))) &&
     (((int)(uint)*(byte *)(in_RDI + 0xe258) < *(int *)(*in_RDI + 0x1a08) ||
      (*(int *)((long)in_RDI + 0x6079c) == 0)))) {
    cVar1 = *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258));
    if ((cVar1 == '\x03') || (cVar1 == '\x06')) {
      if (*(int *)(*in_RDI + 0x5a88) != 0) {
        in_RDI[0x13ac3] = **(long **)(lVar10 + 0x5d58);
      }
    }
    else {
      in_RDI[0x13ac3] = in_RDI[0x13ac3] + -0xe8;
      if (*(int *)(*in_RDI + 0x5a88) == 0) {
        input_stats(in_stack_fffffffffffffe78,(TWO_PASS_FRAME *)in_stack_fffffffffffffe70,
                    in_stack_fffffffffffffe68);
      }
      else {
        input_stats_lap(in_stack_fffffffffffffe78,(TWO_PASS_FRAME *)in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
      }
    }
  }
  *(long *)(lVar4 + 0xad48) = (long)((int)*plVar8 - (int)in_RDI[0xc0ef]) + *(long *)(lVar4 + 0xad48)
  ;
  if (*(long *)(lVar10 + 0x8ad8) - (long)(int)*plVar8 < 1) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)(lVar10 + 0x8ad8) - (long)(int)*plVar8;
  }
  *(long *)(lVar10 + 0x8ad8) = lVar9;
  if ((int)in_RDI[0x135c8] != 0) {
    *(long *)(lVar4 + 0xad50) = *(long *)(lVar4 + 0xad50) - (long)*(int *)((long)in_RDI + 0x60874);
    *(undefined4 *)((long)in_RDI + 0x60874) = 0;
  }
  if (0x7fffffff - (int)*plVar8 < *(int *)(lVar10 + 0x8b10)) {
    *(undefined4 *)(lVar10 + 0x8b10) = 0x7fffffff;
  }
  else {
    *(int *)(lVar10 + 0x8b10) = (int)*plVar8 + *(int *)(lVar10 + 0x8b10);
  }
  *(int *)(lVar10 + 0x8b14) = (int)in_RDI[0xc0ef] + *(int *)(lVar10 + 0x8b14);
  if (*(long *)(lVar4 + 0xad28) == 0) {
    *(undefined4 *)(lVar4 + 0xad40) = 0;
  }
  else {
    *(int *)(lVar4 + 0xad40) = (int)((*(long *)(lVar4 + 0xad48) * 100) / *(long *)(lVar4 + 0xad28));
    iVar6 = clamp(*(int *)(lVar4 + 0xad40),-100,100);
    *(int *)(lVar4 + 0xad40) = iVar6;
  }
  if ((int)in_RDI[0xc0f5] == 0) {
    for (local_120 = *(int *)(*in_RDI + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4);
        local_120 < 7; local_120 = local_120 + 1) {
      *(int *)(lVar4 + 0xaccc + (long)local_120 * 4) = (int)in_RDI[0x783d];
    }
  }
  if ((char)in_RDI[0x77f0] != '\0') {
    *(long *)(lVar10 + 0x8af8) = *(long *)(lVar10 + 0x8af8) - (long)(int)*plVar8;
    *(undefined4 *)(lVar10 + 0x8b20) = *(undefined4 *)(lVar10 + 0x8b1c);
  }
  if (*(long *)(lVar10 + 0x8af8) < 1) {
    cpi_00 = (AV1_COMP *)0x0;
  }
  else {
    cpi_00 = *(AV1_COMP **)(lVar10 + 0x8af8);
  }
  *(AV1_COMP **)(lVar10 + 0x8af8) = cpi_00;
  if (((*(int *)((long)in_RDI + 0x423dc) != 3) && ((int)in_RDI[0xc0f5] == 0)) &&
     (0 < *(int *)(lVar4 + 0xad60))) {
    iVar6 = 0x30;
    if (*(int *)((long)in_RDI + 0x423dc) == 2) {
      iVar6 = 0x14;
    }
    iVar2 = *(int *)((long)in_RDI + 0x6082c);
    iVar3 = *(int *)((long)in_RDI + 0x60844);
    if (((int)in_RDI[0x8479] < 100) && (*(int *)(lVar4 + 0xad64) < *(int *)(lVar4 + 0xad60))) {
      if (((int)in_RDI[0x8479] <=
           ((*(int *)(lVar4 + 0xad60) - *(int *)(lVar4 + 0xad64)) * 100) / *(int *)(lVar4 + 0xad60))
         && (0 < *(int *)(lVar4 + 0xad40))) {
        *(int *)(lVar10 + 0x8b24) = *(int *)(lVar10 + 0x8b24) + 1;
        *(int *)(lVar10 + 0x8b28) = *(int *)(lVar10 + 0x8b28) + -1;
      }
    }
    else if (((*(int *)((long)in_RDI + 0x423cc) < 100) &&
             ((*(int *)(lVar4 + 0xad60) < *(int *)(lVar4 + 0xad64) &&
              (iVar7 = clamp(((*(int *)(lVar4 + 0xad64) - *(int *)(lVar4 + 0xad60)) * 100) /
                             *(int *)(lVar4 + 0xad60),0,100),
              *(int *)((long)in_RDI + 0x423cc) <= iVar7)))) && (*(int *)(lVar4 + 0xad40) < 0)) {
      *(int *)(lVar10 + 0x8b28) = *(int *)(lVar10 + 0x8b28) + 1;
      *(int *)(lVar10 + 0x8b24) = *(int *)(lVar10 + 0x8b24) + -1;
    }
    iVar6 = clamp(*(int *)(lVar10 + 0x8b24),-iVar6,iVar6);
    *(int *)(lVar10 + 0x8b24) = iVar6;
    iVar6 = clamp(*(int *)(lVar10 + 0x8b28),0,iVar2 - iVar3);
    *(int *)(lVar10 + 0x8b28) = iVar6;
    iVar6 = frame_is_kf_gf_arf(cpi_00);
    if (((iVar6 == 0) && ((int)in_RDI[0xc0f5] == 0)) &&
       (iVar6 = (int)*plVar8 / 2, (int)in_RDI[0xc0ef] < iVar6)) {
      *(long *)(lVar4 + 0xad50) = (long)(iVar6 - (int)in_RDI[0xc0ef]) + *(long *)(lVar4 + 0xad50);
      if (*(long *)(lVar4 + 0xad50) < (long)*(int *)((long)in_RDI + 0x607f4) * 4) {
        lVar10 = *(long *)(lVar4 + 0xad50);
      }
      else {
        lVar10 = (long)*(int *)((long)in_RDI + 0x607f4) << 2;
      }
      *(long *)(lVar4 + 0xad50) = lVar10;
    }
  }
  lVar10 = *in_RDI;
  for (local_14c = 0; local_14c <= (int)in_RDI[0x1026d]; local_14c = local_14c + 1) {
    if ((*(int *)((long)in_RDI + (long)local_14c * 4 + 0x9ad94) != 0) &&
       (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
      bVar5 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      for (local_144 = 0; local_144 < 0x13; local_144 = local_144 + 1) {
        local_154 = 0x400;
        for (local_148 = 0xf; -1 < local_148; local_148 = local_148 + -1) {
          local_15c = *(int *)(lVar10 + 0x126cc + (ulong)bVar5 * 0x4c0 + (long)local_144 * 0x40 +
                              (long)local_148 * 4) +
                      *(int *)((long)in_RDI +
                              (long)local_148 * 4 +
                              (long)local_144 * 0x40 +
                              (ulong)bVar5 * 0x4c0 + (long)local_14c * 0x2904 + 0x815f0) >> 1;
          local_154 = local_154 - local_15c;
          if (local_148 == 0) {
            local_15c = local_154 + local_15c;
          }
          *(int *)(lVar10 + 0x126cc + (ulong)bVar5 * 0x4c0 + (long)local_144 * 0x40 +
                  (long)local_148 * 4) = local_15c;
        }
      }
    }
    if ((*(int *)((long)in_RDI + (long)local_14c * 4 + 0x9adbc) != 0) &&
       (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
      bVar5 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      for (local_144 = 0; local_144 < 0x16; local_144 = local_144 + 1) {
        *(int *)(lVar10 + 0x12448 + (ulong)bVar5 * 0x58 + (long)local_144 * 4) =
             *(int *)(lVar10 + 0x12448 + (ulong)bVar5 * 0x58 + (long)local_144 * 4) +
             *(int *)((long)in_RDI +
                     (long)local_144 * 4 + (ulong)bVar5 * 0x58 + (long)local_14c * 0x2904 + 0x8136c)
             >> 1;
      }
    }
    if ((*(int *)((long)in_RDI + (long)local_14c * 4 + 0x9ade4) != 0) &&
       (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
      bVar5 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      *(int *)(lVar10 + 0x126b0 + (ulong)bVar5 * 4) =
           *(int *)(lVar10 + 0x126b0 + (ulong)bVar5 * 4) +
           *(int *)((long)in_RDI + (ulong)bVar5 * 4 + (long)local_14c * 0x2904 + 0x815d4) >> 1;
    }
    if ((*(int *)((long)in_RDI + (long)local_14c * 4 + 0x9ae0c) != 0) &&
       (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
      bVar5 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      for (local_144 = 0; local_144 < 0x10; local_144 = local_144 + 1) {
        local_174 = 0x600;
        for (local_148 = 2; -1 < local_148; local_148 = local_148 + -1) {
          local_17c = *(int *)(lVar10 + 0x1480c + (ulong)bVar5 * 0xc0 + (long)local_144 * 0xc +
                              (long)local_148 * 4) +
                      *(int *)((long)in_RDI +
                              (long)local_148 * 4 +
                              (long)local_144 * 0xc +
                              (ulong)bVar5 * 0xc0 + (long)local_14c * 0x2904 + 0x83730) >> 1;
          local_174 = local_174 - local_17c;
          if (local_148 == 0) {
            local_17c = local_174 + local_17c;
          }
          *(int *)(lVar10 + 0x1480c + (ulong)bVar5 * 0xc0 + (long)local_144 * 0xc +
                  (long)local_148 * 4) = local_17c;
        }
      }
    }
  }
  if (((int)in_RDI[0x782c] != 0) &&
     (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
    in_RDI[0xc116] = in_RDI[0x135c7];
  }
  return;
}

Assistant:

void av1_twopass_postencode_update(AV1_COMP *cpi) {
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;

  // Increment the stats_in pointer.
  if (is_stat_consumption_stage(cpi) &&
      !(cpi->use_ducky_encode && cpi->ducky_encode_info.frame_info.gop_mode ==
                                     DUCKY_ENCODE_GOP_MODE_RCL) &&
      (cpi->gf_frame_index < cpi->ppi->gf_group.size ||
       rc->frames_to_key == 0)) {
    const int update_type = cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
    if (update_type != ARF_UPDATE && update_type != INTNL_ARF_UPDATE) {
      FIRSTPASS_STATS this_frame;
      assert(cpi->twopass_frame.stats_in >
             twopass->stats_buf_ctx->stats_in_start);
      --cpi->twopass_frame.stats_in;
      if (cpi->ppi->lap_enabled) {
        input_stats_lap(twopass, &cpi->twopass_frame, &this_frame);
      } else {
        input_stats(twopass, &cpi->twopass_frame, &this_frame);
      }
    } else if (cpi->ppi->lap_enabled) {
      cpi->twopass_frame.stats_in = twopass->stats_buf_ctx->stats_in_start;
    }
  }

  // VBR correction is done through rc->vbr_bits_off_target. Based on the
  // sign of this value, a limited % adjustment is made to the target rate
  // of subsequent frames, to try and push it back towards 0. This method
  // is designed to prevent extreme behaviour at the end of a clip
  // or group of frames.
  p_rc->vbr_bits_off_target += rc->base_frame_target - rc->projected_frame_size;
  twopass->bits_left = AOMMAX(twopass->bits_left - rc->base_frame_target, 0);

  if (cpi->do_update_vbr_bits_off_target_fast) {
    // Subtract current frame's fast_extra_bits.
    p_rc->vbr_bits_off_target_fast -= rc->frame_level_fast_extra_bits;
    rc->frame_level_fast_extra_bits = 0;
  }

  // Target vs actual bits for this arf group.
  if (twopass->rolling_arf_group_target_bits >
      INT_MAX - rc->base_frame_target) {
    twopass->rolling_arf_group_target_bits = INT_MAX;
  } else {
    twopass->rolling_arf_group_target_bits += rc->base_frame_target;
  }
  twopass->rolling_arf_group_actual_bits += rc->projected_frame_size;

  // Calculate the pct rc error.
  if (p_rc->total_actual_bits) {
    p_rc->rate_error_estimate =
        (int)((p_rc->vbr_bits_off_target * 100) / p_rc->total_actual_bits);
    p_rc->rate_error_estimate = clamp(p_rc->rate_error_estimate, -100, 100);
  } else {
    p_rc->rate_error_estimate = 0;
  }

#if CONFIG_FPMT_TEST
  /* The variables temp_vbr_bits_off_target, temp_bits_left,
   * temp_rolling_arf_group_target_bits, temp_rolling_arf_group_actual_bits
   * temp_rate_error_estimate are introduced for quality simulation purpose,
   * it retains the value previous to the parallel encode frames. The
   * variables are updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  const int simulate_parallel_frame =
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      simulate_parallel_frame) {
    cpi->ppi->p_rc.temp_vbr_bits_off_target = p_rc->vbr_bits_off_target;
    cpi->ppi->p_rc.temp_bits_left = twopass->bits_left;
    cpi->ppi->p_rc.temp_rolling_arf_group_target_bits =
        twopass->rolling_arf_group_target_bits;
    cpi->ppi->p_rc.temp_rolling_arf_group_actual_bits =
        twopass->rolling_arf_group_actual_bits;
    cpi->ppi->p_rc.temp_rate_error_estimate = p_rc->rate_error_estimate;
  }
#endif
  // Update the active best quality pyramid.
  if (!rc->is_src_frame_alt_ref) {
    const int pyramid_level =
        cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index];
    int i;
    for (i = pyramid_level; i <= MAX_ARF_LAYERS; ++i) {
      p_rc->active_best_quality[i] = cpi->common.quant_params.base_qindex;
#if CONFIG_TUNE_VMAF
      if (cpi->vmaf_info.original_qindex != -1 &&
          (cpi->oxcf.tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
           cpi->oxcf.tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN)) {
        p_rc->active_best_quality[i] = cpi->vmaf_info.original_qindex;
      }
#endif
    }
  }

#if 0
  {
    AV1_COMMON *cm = &cpi->common;
    FILE *fpfile;
    fpfile = fopen("details.stt", "a");
    fprintf(fpfile,
            "%10d %10d %10d %10" PRId64 " %10" PRId64
            " %10d %10d %10d %10.4lf %10.4lf %10.4lf %10.4lf\n",
            cm->current_frame.frame_number, rc->base_frame_target,
            rc->projected_frame_size, rc->total_actual_bits,
            rc->vbr_bits_off_target, p_rc->rate_error_estimate,
            twopass->rolling_arf_group_target_bits,
            twopass->rolling_arf_group_actual_bits,
            (double)twopass->rolling_arf_group_actual_bits /
                (double)twopass->rolling_arf_group_target_bits,
            twopass->bpm_factor,
            av1_convert_qindex_to_q(cpi->common.quant_params.base_qindex,
                                    cm->seq_params->bit_depth),
            av1_convert_qindex_to_q(rc->active_worst_quality,
                                    cm->seq_params->bit_depth));
    fclose(fpfile);
  }
#endif

  if (cpi->common.current_frame.frame_type != KEY_FRAME) {
    twopass->kf_group_bits -= rc->base_frame_target;
    twopass->last_kfgroup_zeromotion_pct = twopass->kf_zeromotion_pct;
  }
  twopass->kf_group_bits = AOMMAX(twopass->kf_group_bits, 0);

  // If the rate control is drifting consider adjustment to min or maxq.
  if ((rc_cfg->mode != AOM_Q) && !cpi->rc.is_src_frame_alt_ref &&
      (p_rc->rolling_target_bits > 0)) {
    int minq_adj_limit;
    int maxq_adj_limit;
    minq_adj_limit =
        (rc_cfg->mode == AOM_CQ ? MINQ_ADJ_LIMIT_CQ : MINQ_ADJ_LIMIT);
    maxq_adj_limit = (rc->worst_quality - rc->active_worst_quality);

    // Undershoot
    if ((rc_cfg->under_shoot_pct < 100) &&
        (p_rc->rolling_actual_bits < p_rc->rolling_target_bits)) {
      int pct_error =
          ((p_rc->rolling_target_bits - p_rc->rolling_actual_bits) * 100) /
          p_rc->rolling_target_bits;

      if ((pct_error >= rc_cfg->under_shoot_pct) &&
          (p_rc->rate_error_estimate > 0)) {
        twopass->extend_minq += 1;
        twopass->extend_maxq -= 1;
      }

      // Overshoot
    } else if ((rc_cfg->over_shoot_pct < 100) &&
               (p_rc->rolling_actual_bits > p_rc->rolling_target_bits)) {
      int pct_error =
          ((p_rc->rolling_actual_bits - p_rc->rolling_target_bits) * 100) /
          p_rc->rolling_target_bits;

      pct_error = clamp(pct_error, 0, 100);
      if ((pct_error >= rc_cfg->over_shoot_pct) &&
          (p_rc->rate_error_estimate < 0)) {
        twopass->extend_maxq += 1;
        twopass->extend_minq -= 1;
      }
    }
    twopass->extend_minq =
        clamp(twopass->extend_minq, -minq_adj_limit, minq_adj_limit);
    twopass->extend_maxq = clamp(twopass->extend_maxq, 0, maxq_adj_limit);

    // If there is a big and undexpected undershoot then feed the extra
    // bits back in quickly. One situation where this may happen is if a
    // frame is unexpectedly almost perfectly predicted by the ARF or GF
    // but not very well predcited by the previous frame.
    if (!frame_is_kf_gf_arf(cpi) && !cpi->rc.is_src_frame_alt_ref) {
      int fast_extra_thresh = rc->base_frame_target / HIGH_UNDERSHOOT_RATIO;
      if (rc->projected_frame_size < fast_extra_thresh) {
        p_rc->vbr_bits_off_target_fast +=
            fast_extra_thresh - rc->projected_frame_size;
        p_rc->vbr_bits_off_target_fast =
            AOMMIN(p_rc->vbr_bits_off_target_fast,
                   (4 * (int64_t)rc->avg_frame_bandwidth));
      }
    }

#if CONFIG_FPMT_TEST
    if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
        simulate_parallel_frame) {
      cpi->ppi->p_rc.temp_vbr_bits_off_target_fast =
          p_rc->vbr_bits_off_target_fast;
      cpi->ppi->p_rc.temp_extend_minq = twopass->extend_minq;
      cpi->ppi->p_rc.temp_extend_maxq = twopass->extend_maxq;
    }
#endif
  }

  // Update the frame probabilities obtained from parallel encode frames
  FrameProbInfo *const frame_probs = &cpi->ppi->frame_probs;
#if CONFIG_FPMT_TEST
  /* The variable temp_active_best_quality is introduced only for quality
   * simulation purpose, it retains the value previous to the parallel
   * encode frames. The variable is updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      simulate_parallel_frame) {
    int i;
    const int pyramid_level =
        cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index];
    if (!rc->is_src_frame_alt_ref) {
      for (i = pyramid_level; i <= MAX_ARF_LAYERS; ++i)
        cpi->ppi->p_rc.temp_active_best_quality[i] =
            p_rc->active_best_quality[i];
    }
  }

  // Update the frame probabilities obtained from parallel encode frames
  FrameProbInfo *const temp_frame_probs_simulation =
      simulate_parallel_frame ? &cpi->ppi->temp_frame_probs_simulation
                              : frame_probs;
  FrameProbInfo *const temp_frame_probs =
      simulate_parallel_frame ? &cpi->ppi->temp_frame_probs : NULL;
#endif
  int i, j, loop;
  // Sequentially do average on temp_frame_probs_simulation which holds
  // probabilities of last frame before parallel encode
  for (loop = 0; loop <= cpi->num_frame_recode; loop++) {
    // Sequentially update tx_type_probs
    if (cpi->do_update_frame_probs_txtype[loop] &&
        (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
      for (i = 0; i < TX_SIZES_ALL; i++) {
        int left = 1024;

        for (j = TX_TYPES - 1; j >= 0; j--) {
          const int new_prob =
              cpi->frame_new_probs[loop].tx_type_probs[update_type][i][j];
#if CONFIG_FPMT_TEST
          int prob =
              (temp_frame_probs_simulation->tx_type_probs[update_type][i][j] +
               new_prob) >>
              1;
          left -= prob;
          if (j == 0) prob += left;
          temp_frame_probs_simulation->tx_type_probs[update_type][i][j] = prob;
#else
          int prob =
              (frame_probs->tx_type_probs[update_type][i][j] + new_prob) >> 1;
          left -= prob;
          if (j == 0) prob += left;
          frame_probs->tx_type_probs[update_type][i][j] = prob;
#endif
        }
      }
    }

    // Sequentially update obmc_probs
    if (cpi->do_update_frame_probs_obmc[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

      for (i = 0; i < BLOCK_SIZES_ALL; i++) {
        const int new_prob =
            cpi->frame_new_probs[loop].obmc_probs[update_type][i];
#if CONFIG_FPMT_TEST
        temp_frame_probs_simulation->obmc_probs[update_type][i] =
            (temp_frame_probs_simulation->obmc_probs[update_type][i] +
             new_prob) >>
            1;
#else
        frame_probs->obmc_probs[update_type][i] =
            (frame_probs->obmc_probs[update_type][i] + new_prob) >> 1;
#endif
      }
    }

    // Sequentially update warped_probs
    if (cpi->do_update_frame_probs_warp[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
      const int new_prob = cpi->frame_new_probs[loop].warped_probs[update_type];
#if CONFIG_FPMT_TEST
      temp_frame_probs_simulation->warped_probs[update_type] =
          (temp_frame_probs_simulation->warped_probs[update_type] + new_prob) >>
          1;
#else
      frame_probs->warped_probs[update_type] =
          (frame_probs->warped_probs[update_type] + new_prob) >> 1;
#endif
    }

    // Sequentially update switchable_interp_probs
    if (cpi->do_update_frame_probs_interpfilter[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

      for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) {
        int left = 1536;

        for (j = SWITCHABLE_FILTERS - 1; j >= 0; j--) {
          const int new_prob = cpi->frame_new_probs[loop]
                                   .switchable_interp_probs[update_type][i][j];
#if CONFIG_FPMT_TEST
          int prob = (temp_frame_probs_simulation
                          ->switchable_interp_probs[update_type][i][j] +
                      new_prob) >>
                     1;
          left -= prob;
          if (j == 0) prob += left;

          temp_frame_probs_simulation
              ->switchable_interp_probs[update_type][i][j] = prob;
#else
          int prob = (frame_probs->switchable_interp_probs[update_type][i][j] +
                      new_prob) >>
                     1;
          left -= prob;
          if (j == 0) prob += left;
          frame_probs->switchable_interp_probs[update_type][i][j] = prob;
#endif
        }
      }
    }
  }

#if CONFIG_FPMT_TEST
  // Copying temp_frame_probs_simulation to temp_frame_probs based on
  // the flag
  if (cpi->do_frame_data_update &&
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
      simulate_parallel_frame) {
    for (int update_type_idx = 0; update_type_idx < FRAME_UPDATE_TYPES;
         update_type_idx++) {
      for (i = 0; i < BLOCK_SIZES_ALL; i++) {
        temp_frame_probs->obmc_probs[update_type_idx][i] =
            temp_frame_probs_simulation->obmc_probs[update_type_idx][i];
      }
      temp_frame_probs->warped_probs[update_type_idx] =
          temp_frame_probs_simulation->warped_probs[update_type_idx];
      for (i = 0; i < TX_SIZES_ALL; i++) {
        for (j = 0; j < TX_TYPES; j++) {
          temp_frame_probs->tx_type_probs[update_type_idx][i][j] =
              temp_frame_probs_simulation->tx_type_probs[update_type_idx][i][j];
        }
      }
      for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) {
        for (j = 0; j < SWITCHABLE_FILTERS; j++) {
          temp_frame_probs->switchable_interp_probs[update_type_idx][i][j] =
              temp_frame_probs_simulation
                  ->switchable_interp_probs[update_type_idx][i][j];
        }
      }
    }
  }
#endif
  // Update framerate obtained from parallel encode frames
  if (cpi->common.show_frame &&
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
    cpi->framerate = cpi->new_framerate;
#if CONFIG_FPMT_TEST
  // SIMULATION PURPOSE
  int show_existing_between_parallel_frames_cndn =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);
  if (cpi->common.show_frame && !show_existing_between_parallel_frames_cndn &&
      cpi->do_frame_data_update && simulate_parallel_frame)
    cpi->temp_framerate = cpi->framerate;
#endif
}